

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_spatializer_listener_config * ma_spatializer_listener_config_init(ma_uint32 channelsOut)

{
  ma_spatializer_listener_config *in_RDI;
  
  *(undefined8 *)in_RDI = 0;
  in_RDI->pChannelMapOut = (ma_channel *)0x0;
  in_RDI->channelsOut = channelsOut;
  in_RDI->handedness = ma_handedness_right;
  (in_RDI->worldUp).x = 0.0;
  (in_RDI->worldUp).y = 1.0;
  (in_RDI->worldUp).z = 0.0;
  in_RDI->coneInnerAngleInRadians = 6.283185;
  in_RDI->coneOuterAngleInRadians = 6.283185;
  in_RDI->coneOuterGain = 0.0;
  in_RDI->speedOfSound = 343.3;
  return in_RDI;
}

Assistant:

MA_API ma_spatializer_listener_config ma_spatializer_listener_config_init(ma_uint32 channelsOut)
{
    ma_spatializer_listener_config config;

    MA_ZERO_OBJECT(&config);
    config.channelsOut             = channelsOut;
    config.pChannelMapOut          = NULL;
    config.handedness              = ma_handedness_right;
    config.worldUp                 = ma_vec3f_init_3f(0, 1,  0);
    config.coneInnerAngleInRadians = 6.283185f; /* 360 degrees. */
    config.coneOuterAngleInRadians = 6.283185f; /* 360 degrees. */
    config.coneOuterGain           = 0;
    config.speedOfSound            = 343.3f;    /* Same as OpenAL. Used for doppler effect. */

    return config;
}